

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTFluctuationBenchmarks.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  VDetector *detector;
  RandomGen *this;
  ostream *poVar2;
  size_t i;
  long lVar3;
  long *plVar4;
  size_type sVar5;
  pointer pdVar6;
  pointer pdVar7;
  double *pdVar8;
  long lVar9;
  LArNESTResult *pLVar10;
  uint64_t s;
  ulong uVar11;
  pointer pdVar12;
  pointer pdVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  initializer_list<NEST::LArInteraction> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<double,_std::allocator<double>_> energy_vals;
  vector<double,_std::allocator<double>_> electric_field;
  vector<double,_std::allocator<double>_> Nion;
  vector<double,_std::allocator<double>_> Nex;
  vector<double,_std::allocator<double>_> Ne;
  vector<double,_std::allocator<double>_> Nph;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  ofstream output_file;
  LArNEST larnest;
  long local_958;
  size_type local_950;
  vector<double,_std::allocator<double>_> local_928;
  ulong local_910;
  void *local_908;
  void *pvStack_900;
  long local_8f8;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  double local_8d0;
  vector<double,_std::allocator<double>_> local_8c8;
  vector<double,_std::allocator<double>_> local_8b0;
  vector<double,_std::allocator<double>_> local_898;
  vector<double,_std::allocator<double>_> local_880;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> local_868;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  ulong local_828;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_820;
  LArNESTResult local_808;
  long local_780;
  filebuf local_778 [240];
  ios_base local_688 [264];
  undefined1 local_580 [32];
  undefined1 *local_560;
  undefined1 local_550 [16];
  long *local_540 [2];
  long local_530 [160];
  
  bVar14 = 0;
  if (argc < 2) {
    local_830 = 1.393;
  }
  else {
    local_830 = atof(argv[1]);
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      s = (uint64_t)iVar1;
      if ((uint)argc < 4) {
        local_950 = 100;
      }
      else {
        iVar1 = atoi(argv[3]);
        local_950 = (size_type)iVar1;
      }
      goto LAB_00103b82;
    }
  }
  local_950 = 100;
  s = 0;
LAB_00103b82:
  local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  lVar3 = 0;
  do {
    local_580._0_8_ = (double)lVar3 * 0.019998 + 0.1;
    if (local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_928,
                 (iterator)
                 local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_580);
    }
    else {
      *local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_580._0_8_;
      local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 50000);
  local_580._0_8_ = (pointer)0x100000000;
  local_580._8_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)local_580;
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            (&local_868,__l,(allocator_type *)&local_780);
  local_580._0_8_ = local_580 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"NR","");
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"ER","");
  plVar4 = local_530;
  local_540[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"Alpha","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_580;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_820,__l_00,(allocator_type *)&local_780);
  lVar3 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  detector = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector);
  NEST::LArNEST::LArNEST((LArNEST *)local_580,detector);
  this = RandomGen::rndm();
  RandomGen::SetSeed(this,s);
  std::ofstream::ofstream(&local_780);
  std::ofstream::open((char *)&local_780,0x117284);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_780,
             "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
             ,0x93);
  if (local_868.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_868.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pdVar12 = (pointer)0x0;
    pdVar6 = (pointer)0x0;
  }
  else {
    auVar18._8_4_ = (int)(local_950 >> 0x20);
    auVar18._0_8_ = local_950;
    auVar18._12_4_ = 0x45300000;
    dStack_8e0 = auVar18._8_8_ - 1.9342813113834067e+25;
    local_8e8 = dStack_8e0 + ((double)CONCAT44(0x43300000,(int)local_950) - 4503599627370496.0);
    uVar11 = 0;
    pdVar6 = (pointer)0x0;
    pdVar12 = (pointer)0x0;
    do {
      local_908 = (void *)0x0;
      pvStack_900 = (void *)0x0;
      local_8f8 = 0;
      if (local_868.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11] == ER) {
        pdVar8 = (double *)&DAT_001171c8;
        pLVar10 = &local_808;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pLVar10->yields).TotalYield = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          pLVar10 = (LArNESTResult *)((long)pLVar10 + (ulong)bVar14 * -0x10 + 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_908,0,&local_808,
                   &local_808.fluctuations.NeFluctuation);
      }
      else if (local_868.
               super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11] == NR) {
        pdVar8 = (double *)&DAT_00117178;
        pLVar10 = &local_808;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pLVar10->yields).TotalYield = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          pLVar10 = (LArNESTResult *)((long)pLVar10 + (ulong)bVar14 * -0x10 + 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_908,0,&local_808,
                   &local_808.fluctuations.NeFluctuation);
      }
      else {
        local_808.yields.Nion = 10000.0;
        local_808.yields.Lindhard = 20000.0;
        local_808.yields.Ne = 1000.0;
        local_808.yields.Nex = 5000.0;
        local_808.yields.LightYield = 100.0;
        local_808.yields.Nph = 500.0;
        local_808.yields.TotalYield = 1.0;
        local_808.yields.QuantaYield = 50.0;
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_908,0,&local_808,
                   &local_808.yields.ElectricField);
      }
      if (pvStack_900 != local_908) {
        local_910 = 0;
        local_828 = uVar11;
        do {
          local_958 = 0;
          do {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_880,local_950,(allocator_type *)&local_808);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_898,local_950,(allocator_type *)&local_808);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_8b0,local_950,(allocator_type *)&local_808);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_8c8,local_950,(allocator_type *)&local_808);
            if (local_950 != 0) {
              sVar5 = 0;
              pdVar7 = pdVar6;
              pdVar13 = pdVar12;
              do {
                NEST::LArNEST::FullCalculation
                          (&local_808,(LArNEST *)local_580,
                           local_868.
                           super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_828],
                           local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_958],0.0,
                           *(double *)((long)local_908 + local_910 * 8),local_830,false);
                pdVar12 = local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pdVar6 = local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                dVar16 = local_808.fluctuations.NionFluctuation;
                dVar15 = local_808.fluctuations.NexFluctuation;
                dVar19 = local_808.fluctuations.NeFluctuation;
                dVar21 = local_808.fluctuations.NphFluctuation;
                local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pdVar7 != (pointer)0x0) &&
                   (operator_delete(pdVar7,(long)pdVar13 - (long)pdVar7),
                   local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_808.photon_times.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_808.photon_times.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_808.photon_times.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar21;
                local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar19;
                local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar15;
                local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar16;
                sVar5 = sVar5 + 1;
                pdVar7 = pdVar6;
                pdVar13 = pdVar12;
              } while (local_950 != sVar5);
            }
            uVar11 = local_828;
            dVar21 = 0.0;
            for (pdVar8 = local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar8 != local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
              dVar21 = dVar21 + *pdVar8;
            }
            dVar19 = 0.0;
            for (pdVar8 = local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar8 != local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
              dVar19 = dVar19 + *pdVar8;
            }
            dVar15 = 0.0;
            for (pdVar7 = local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar7 != local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
              dVar15 = dVar15 + *pdVar7;
            }
            dVar16 = 0.0;
            for (pdVar8 = local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar8 != local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
              dVar16 = dVar16 + *pdVar8;
            }
            dVar21 = dVar21 / local_8e8;
            dVar19 = dVar19 / local_8e8;
            local_838 = dVar21 + dVar19;
            if (local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar9 = 0;
              do {
                dVar20 = (local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar9] +
                         local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9]) - local_838;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar9 = lVar9 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_840 = sqrt(dVar17);
            }
            else {
              local_840 = SQRT(dVar17);
            }
            if ((long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar9 = 0;
              do {
                dVar17 = dVar17 + (local_880.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar9] - dVar21) *
                                  (local_880.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar9] - dVar21);
                lVar9 = lVar9 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_8d0 = sqrt(dVar17);
            }
            else {
              local_8d0 = SQRT(dVar17);
            }
            if ((long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar9 = 0;
              do {
                dVar17 = dVar17 + (local_898.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar9] - dVar19) *
                                  (local_898.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar9] - dVar19);
                lVar9 = lVar9 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_8d8 = sqrt(dVar17);
            }
            else {
              local_8d8 = SQRT(dVar17);
            }
            dVar15 = dVar15 / local_8e8;
            if ((long)local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar9 = 0;
              do {
                dVar20 = local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9] - dVar15;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar9 = lVar9 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_848 = sqrt(dVar17);
            }
            else {
              local_848 = SQRT(dVar17);
            }
            dVar16 = dVar16 / local_8e8;
            if ((long)local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar9 = 0;
              do {
                dVar20 = local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9] - dVar16;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar9 = lVar9 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar9);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_850 = sqrt(dVar17);
            }
            else {
              local_850 = SQRT(dVar17);
            }
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_780,
                                local_820.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                                local_820.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_928.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_908 + local_910 * 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_838 /
                                local_928.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (dVar19 / local_928.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (dVar21 / local_928.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_840 /
                                local_928.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_8d8 /
                                local_928.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_8d0 /
                                local_928.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_8d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_8d8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_848);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_850);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            if (local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_8c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_8c8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_8c8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_8b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_8b0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_8b0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_898.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_898.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_880.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_880.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_880.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_958 = local_958 + 1;
          } while (local_958 != 50000);
          local_910 = local_910 + 1;
        } while (local_910 < (ulong)((long)pvStack_900 - (long)local_908 >> 3));
      }
      if (local_908 != (void *)0x0) {
        operator_delete(local_908,local_8f8 - (long)local_908);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)local_868.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_868.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  local_780 = _VTT;
  *(undefined8 *)(local_778 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_778);
  std::ios_base::~ios_base(local_688);
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar12 - (long)pdVar6);
  }
  NEST::LArNEST::~LArNEST((LArNEST *)local_580);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_820);
  if (local_868.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_868.
                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_868.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_868.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_928.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  uint64_t num_events = 100;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }
  if (argc > 3) {
    num_events = atoi(argv[3]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("fluctuation_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    // iterate over number of events
    for (size_t v = 0; v < electric_field.size(); v++) {
      for (size_t i = 0; i < num_energy_steps; i++) {
        std::vector<double> Nph(num_events);
        std::vector<double> Ne(num_events);
        std::vector<double> Nex(num_events);
        std::vector<double> Nion(num_events);
        // collect statistics for each event
        for (size_t j = 0; j < num_events; j++) {
          result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                           electric_field[v], density, false);
          Nph[j] = double(result.fluctuations.NphFluctuation);
          Ne[j] = double(result.fluctuations.NeFluctuation);
          Nex[j] = double(result.fluctuations.NexFluctuation);
          Nion[j] = double(result.fluctuations.NionFluctuation);
        }
        double Nph_mean =
            std::accumulate(Nph.begin(), Nph.end(), 0.0) / double(num_events);
        double Ne_mean =
            std::accumulate(Ne.begin(), Ne.end(), 0.0) / double(num_events);
        double Nex_mean =
            std::accumulate(Nex.begin(), Nex.end(), 0.0) / double(num_events);
        double Nion_mean =
            std::accumulate(Nion.begin(), Nion.end(), 0.0) / double(num_events);

        double Nq_mean = Nph_mean + Ne_mean;
        double Nq_std = 0.0;
        double Nph_std = 0.0;
        double Ne_std = 0.0;
        double Nex_std = 0.0;
        double Nion_std = 0.0;

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nq_std += (Nph[ii] + Ne[ii] - Nq_mean) * (Nph[ii] + Ne[ii] - Nq_mean);
        }
        Nq_std = std::sqrt(Nq_std / double(num_events));

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nph_std += (Nph[ii] - Nph_mean) * (Nph[ii] - Nph_mean);
        }
        Nph_std = std::sqrt(Nph_std / double(num_events));

        for (size_t ii = 0; ii < Ne.size(); ii++) {
          Ne_std += (Ne[ii] - Ne_mean) * (Ne[ii] - Ne_mean);
        }
        Ne_std = std::sqrt(Ne_std / double(num_events));

        for (size_t ii = 0; ii < Nex.size(); ii++) {
          Nex_std += (Nex[ii] - Nex_mean) * (Nex[ii] - Nex_mean);
        }
        Nex_std = std::sqrt(Nex_std / double(num_events));

        for (size_t ii = 0; ii < Nion.size(); ii++) {
          Nion_std += (Nion[ii] - Nion_mean) * (Nion[ii] - Nion_mean);
        }
        Nion_std = std::sqrt(Nion_std / double(num_events));

        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << (Nq_mean / energy_vals[i]) << ",";
        output_file << (Ne_mean / energy_vals[i]) << ",";
        output_file << (Nph_mean / energy_vals[i]) << ",";
        output_file << Nph_mean << ",";
        output_file << Ne_mean << ",";
        output_file << Nex_mean << ",";
        output_file << Nion_mean << ",";
        output_file << (Nq_std / energy_vals[i]) << ",";
        output_file << (Ne_std / energy_vals[i]) << ",";
        output_file << (Nph_std / energy_vals[i]) << ",";
        output_file << Nph_std << ",";
        output_file << Ne_std << ",";
        output_file << Nex_std << ",";
        output_file << Nion_std << "\n";
      }
    }
  }
  output_file.close();
  return 0;
}